

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StandardShapes.cpp
# Opt level: O3

void Assimp::StandardShapes::MakeCone
               (ai_real height,ai_real radius1,ai_real radius2,uint tess,
               vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *positions,bool bOpen)

{
  pointer *ppaVar1;
  undefined4 uVar2;
  undefined8 uVar3;
  pointer paVar4;
  long lVar5;
  int iVar6;
  ulong uVar7;
  iterator iVar8;
  size_t p;
  ulong uVar9;
  float fVar10;
  uint in_XMM0_Db;
  uint in_XMM0_Dc;
  uint in_XMM0_Dd;
  float fVar11;
  uint in_XMM1_Db;
  uint in_XMM1_Dc;
  uint in_XMM1_Dd;
  uint in_XMM2_Db;
  uint in_XMM2_Dc;
  uint in_XMM2_Dd;
  aiVector3D v1;
  aiVector3D v3;
  aiVector3D v4;
  aiVector3D v2;
  aiVector3t<float> local_e4;
  aiVector3t<float> local_d8;
  float local_c8;
  uint uStack_c4;
  uint uStack_c0;
  uint uStack_bc;
  float local_b0;
  float local_ac;
  float local_a8;
  uint uStack_a4;
  uint uStack_a0;
  uint uStack_9c;
  float local_98;
  float local_94;
  aiVector3t<float> local_90;
  float local_84;
  float local_80;
  float local_7c;
  float local_78;
  float local_74;
  float local_70;
  float local_6c;
  float local_68;
  float local_64;
  aiVector3t<float> local_60;
  aiVector3t<float> local_54;
  float local_48;
  uint uStack_44;
  uint uStack_40;
  uint uStack_3c;
  
  if (height != 0.0 && 2 < tess) {
    uVar7 = ((long)(positions->
                   super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(positions->
                   super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
                   _M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555;
    fVar11 = ABS(radius1);
    local_c8 = height * 0.5;
    local_a8 = ABS(radius2);
    uStack_a4 = in_XMM2_Db & 0x7fffffff;
    uStack_a0 = in_XMM2_Dc & 0x7fffffff;
    uStack_9c = in_XMM2_Dd & 0x7fffffff;
    uVar9 = 0xffffffffffffffff;
    fVar10 = fVar11;
    uStack_c4 = in_XMM0_Db;
    uStack_c0 = in_XMM0_Dc;
    uStack_bc = in_XMM0_Dd;
    if (fVar11 < local_a8) {
      local_c8 = -local_c8;
      uStack_c4 = in_XMM0_Db ^ 0x80000000;
      uStack_c0 = in_XMM0_Dc ^ 0x80000000;
      uStack_bc = in_XMM0_Dd ^ 0x80000000;
      uVar9 = uVar7;
      fVar10 = local_a8;
      local_a8 = fVar11;
      uStack_a4 = in_XMM1_Db & 0x7fffffff;
      uStack_a0 = in_XMM1_Dc & 0x7fffffff;
      uStack_9c = in_XMM1_Dd & 0x7fffffff;
    }
    local_b0 = 0.0;
    if ((local_a8 - fVar10) * 0.01 <= fVar10) {
      local_b0 = fVar10;
    }
    iVar6 = tess * 3 << (local_b0 != 0.0);
    if (bOpen) {
      iVar6 = 0;
    }
    std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::reserve
              (positions,uVar7 + (iVar6 + tess * 6));
    local_84 = 6.2831855 / (float)tess;
    local_48 = -local_c8;
    uStack_44 = uStack_c4 ^ 0x80000000;
    uStack_40 = uStack_c0 ^ 0x80000000;
    uStack_3c = uStack_bc ^ 0x80000000;
    local_ac = 1.0;
    local_94 = 0.0;
    local_98 = 0.0;
    do {
      local_54.y = local_c8;
      local_94 = local_94 + local_84;
      local_74 = local_b0 * local_ac;
      local_d8.z = local_b0 * local_98;
      local_d8.y = local_48;
      local_d8.x = local_74;
      local_6c = local_ac * local_a8;
      local_70 = local_98 * local_a8;
      local_78 = local_d8.z;
      local_54.x = local_6c;
      local_54.z = local_70;
      local_ac = cosf(local_94);
      local_98 = sinf(local_94);
      local_90.x = local_a8 * local_ac;
      local_90.z = local_a8 * local_98;
      local_90.y = local_c8;
      local_7c = local_b0 * local_ac;
      local_80 = local_b0 * local_98;
      local_60.y = local_48;
      iVar8._M_current =
           (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
           _M_impl.super__Vector_impl_data._M_finish;
      local_68 = local_90.z;
      local_64 = local_90.x;
      local_60.x = local_7c;
      local_60.z = local_80;
      if (iVar8._M_current ==
          (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
        _M_realloc_insert<aiVector3t<float>const&>
                  ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)positions,iVar8,
                   &local_d8);
        iVar8._M_current =
             (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>)
             ._M_impl.super__Vector_impl_data._M_finish;
      }
      else {
        (iVar8._M_current)->z = local_d8.z;
        (iVar8._M_current)->x = local_d8.x;
        (iVar8._M_current)->y = local_d8.y;
        iVar8._M_current =
             (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>)
             ._M_impl.super__Vector_impl_data._M_finish + 1;
        (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
        _M_impl.super__Vector_impl_data._M_finish = iVar8._M_current;
      }
      if (iVar8._M_current ==
          (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
        _M_realloc_insert<aiVector3t<float>const&>
                  ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)positions,iVar8,
                   &local_54);
        iVar8._M_current =
             (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>)
             ._M_impl.super__Vector_impl_data._M_finish;
      }
      else {
        (iVar8._M_current)->z = local_54.z;
        (iVar8._M_current)->x = local_54.x;
        (iVar8._M_current)->y = local_54.y;
        iVar8._M_current =
             (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>)
             ._M_impl.super__Vector_impl_data._M_finish + 1;
        (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
        _M_impl.super__Vector_impl_data._M_finish = iVar8._M_current;
      }
      if (iVar8._M_current ==
          (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
        _M_realloc_insert<aiVector3t<float>const&>
                  ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)positions,iVar8,
                   &local_90);
        iVar8._M_current =
             (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>)
             ._M_impl.super__Vector_impl_data._M_finish;
      }
      else {
        (iVar8._M_current)->z = local_90.z;
        (iVar8._M_current)->x = local_90.x;
        (iVar8._M_current)->y = local_90.y;
        iVar8._M_current =
             (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>)
             ._M_impl.super__Vector_impl_data._M_finish + 1;
        (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
        _M_impl.super__Vector_impl_data._M_finish = iVar8._M_current;
      }
      if (iVar8._M_current ==
          (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
        _M_realloc_insert<aiVector3t<float>const&>
                  ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)positions,iVar8,
                   &local_60);
        iVar8._M_current =
             (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>)
             ._M_impl.super__Vector_impl_data._M_finish;
      }
      else {
        (iVar8._M_current)->z = local_60.z;
        (iVar8._M_current)->x = local_60.x;
        (iVar8._M_current)->y = local_60.y;
        iVar8._M_current =
             (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>)
             ._M_impl.super__Vector_impl_data._M_finish + 1;
        (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
        _M_impl.super__Vector_impl_data._M_finish = iVar8._M_current;
      }
      if (iVar8._M_current ==
          (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
        _M_realloc_insert<aiVector3t<float>const&>
                  ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)positions,iVar8,
                   &local_d8);
        iVar8._M_current =
             (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>)
             ._M_impl.super__Vector_impl_data._M_finish;
      }
      else {
        (iVar8._M_current)->z = local_d8.z;
        (iVar8._M_current)->x = local_d8.x;
        (iVar8._M_current)->y = local_d8.y;
        iVar8._M_current =
             (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>)
             ._M_impl.super__Vector_impl_data._M_finish + 1;
        (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
        _M_impl.super__Vector_impl_data._M_finish = iVar8._M_current;
      }
      if (iVar8._M_current ==
          (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
        _M_realloc_insert<aiVector3t<float>const&>
                  ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)positions,iVar8,
                   &local_90);
      }
      else {
        (iVar8._M_current)->z = local_90.z;
        (iVar8._M_current)->x = local_90.x;
        (iVar8._M_current)->y = local_90.y;
        ppaVar1 = &(positions->
                   super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
                   _M_impl.super__Vector_impl_data._M_finish;
        *ppaVar1 = *ppaVar1 + 1;
      }
      if (!bOpen) {
        local_e4.x = local_6c;
        local_e4.z = local_70;
        iVar8._M_current =
             (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>)
             ._M_impl.super__Vector_impl_data._M_finish;
        if (iVar8._M_current ==
            (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          local_e4.y = local_c8;
          std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
          _M_realloc_insert<aiVector3t<float>>
                    ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)positions,iVar8,
                     &local_e4);
          iVar8._M_current =
               (positions->
               super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>)._M_impl.
               super__Vector_impl_data._M_finish;
        }
        else {
          (iVar8._M_current)->z = local_70;
          (iVar8._M_current)->x = local_6c;
          (iVar8._M_current)->y = local_c8;
          iVar8._M_current =
               (positions->
               super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>)._M_impl.
               super__Vector_impl_data._M_finish + 1;
          (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
          _M_impl.super__Vector_impl_data._M_finish = iVar8._M_current;
        }
        local_e4.x = local_64;
        local_e4.z = local_68;
        if (iVar8._M_current ==
            (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          local_e4.y = local_c8;
          std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
          _M_realloc_insert<aiVector3t<float>>
                    ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)positions,iVar8,
                     &local_e4);
          iVar8._M_current =
               (positions->
               super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>)._M_impl.
               super__Vector_impl_data._M_finish;
        }
        else {
          (iVar8._M_current)->z = local_68;
          (iVar8._M_current)->x = local_64;
          (iVar8._M_current)->y = local_c8;
          iVar8._M_current =
               (positions->
               super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>)._M_impl.
               super__Vector_impl_data._M_finish + 1;
          (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
          _M_impl.super__Vector_impl_data._M_finish = iVar8._M_current;
        }
        local_e4.x = 0.0;
        local_e4.z = 0.0;
        local_e4.y = local_c8;
        if (iVar8._M_current ==
            (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
          _M_realloc_insert<aiVector3t<float>>
                    ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)positions,iVar8,
                     &local_e4);
        }
        else {
          (iVar8._M_current)->z = 0.0;
          (iVar8._M_current)->x = (float)(int)((ulong)(uint)local_c8 << 0x20);
          (iVar8._M_current)->y = (float)(int)(((ulong)(uint)local_c8 << 0x20) >> 0x20);
          ppaVar1 = &(positions->
                     super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
                     _M_impl.super__Vector_impl_data._M_finish;
          *ppaVar1 = *ppaVar1 + 1;
        }
        if ((local_b0 != 0.0) || (NAN(local_b0))) {
          local_e4.x = local_74;
          local_e4.y = local_48;
          local_e4.z = local_78;
          iVar8._M_current =
               (positions->
               super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>)._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar8._M_current ==
              (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
              )._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
            _M_realloc_insert<aiVector3t<float>>
                      ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)positions,
                       iVar8,&local_e4);
            iVar8._M_current =
                 (positions->
                 super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>)._M_impl
                 .super__Vector_impl_data._M_finish;
          }
          else {
            (iVar8._M_current)->z = local_78;
            (iVar8._M_current)->x = local_74;
            (iVar8._M_current)->y = local_48;
            iVar8._M_current =
                 (positions->
                 super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>)._M_impl
                 .super__Vector_impl_data._M_finish + 1;
            (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
            _M_impl.super__Vector_impl_data._M_finish = iVar8._M_current;
          }
          local_e4.x = local_7c;
          local_e4.y = local_48;
          local_e4.z = local_80;
          if (iVar8._M_current ==
              (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
              )._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
            _M_realloc_insert<aiVector3t<float>>
                      ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)positions,
                       iVar8,&local_e4);
            iVar8._M_current =
                 (positions->
                 super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>)._M_impl
                 .super__Vector_impl_data._M_finish;
          }
          else {
            (iVar8._M_current)->z = local_80;
            (iVar8._M_current)->x = local_7c;
            (iVar8._M_current)->y = local_48;
            iVar8._M_current =
                 (positions->
                 super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>)._M_impl
                 .super__Vector_impl_data._M_finish + 1;
            (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
            _M_impl.super__Vector_impl_data._M_finish = iVar8._M_current;
          }
          local_e4.x = 0.0;
          local_e4.y = local_48;
          local_e4.z = 0.0;
          if (iVar8._M_current ==
              (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
              )._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
            _M_realloc_insert<aiVector3t<float>>
                      ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)positions,
                       iVar8,&local_e4);
          }
          else {
            (iVar8._M_current)->z = 0.0;
            (iVar8._M_current)->x = (float)(int)((ulong)(uint)local_48 << 0x20);
            (iVar8._M_current)->y = (float)(int)(((ulong)(uint)local_48 << 0x20) >> 0x20);
            ppaVar1 = &(positions->
                       super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
                       _M_impl.super__Vector_impl_data._M_finish;
            *ppaVar1 = *ppaVar1 + 1;
          }
        }
      }
    } while (local_94 < 6.2831855);
    if ((uVar9 != 0xffffffffffffffff) &&
       (paVar4 = (positions->
                 super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>)._M_impl
                 .super__Vector_impl_data._M_start,
       uVar9 < (ulong)(((long)(positions->
                              super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                              )._M_impl.super__Vector_impl_data._M_finish - (long)paVar4 >> 2) *
                      -0x5555555555555555))) {
      lVar5 = uVar9 * 0xc;
      do {
        uVar2 = *(undefined4 *)((long)&paVar4->z + lVar5);
        uVar3 = *(undefined8 *)((long)&paVar4->x + lVar5);
        *(undefined8 *)((long)&paVar4->x + lVar5) = *(undefined8 *)((long)&paVar4[1].x + lVar5);
        *(undefined4 *)((long)&paVar4->z + lVar5) = *(undefined4 *)((long)&paVar4[1].z + lVar5);
        *(undefined8 *)((long)&paVar4[1].x + lVar5) = uVar3;
        *(undefined4 *)((long)&paVar4[1].z + lVar5) = uVar2;
        uVar9 = uVar9 + 3;
        paVar4 = (positions->
                 super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>)._M_impl
                 .super__Vector_impl_data._M_start;
        lVar5 = lVar5 + 0x24;
      } while (uVar9 < (ulong)(((long)(positions->
                                      super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                      )._M_impl.super__Vector_impl_data._M_finish - (long)paVar4 >>
                               2) * -0x5555555555555555));
    }
  }
  return;
}

Assistant:

void StandardShapes::MakeCone(ai_real height,ai_real radius1,
    ai_real radius2,unsigned int tess,
    std::vector<aiVector3D>& positions,bool bOpen /*= false */)
{
    // Sorry, a cone with less than 3 segments makes ABSOLUTELY NO SENSE
    if (tess < 3 || !height)
        return;

    size_t old = positions.size();

    // No negative radii
    radius1 = std::fabs(radius1);
    radius2 = std::fabs(radius2);

    ai_real halfHeight = height / ai_real(2.0);

    // radius1 is always the smaller one
    if (radius2 > radius1)
    {
        std::swap(radius2,radius1);
        halfHeight = -halfHeight;
    }
    else old = SIZE_MAX;

    // Use a large epsilon to check whether the cone is pointy
    if (radius1 < (radius2-radius1)*10e-3)radius1 = 0.0;

    // We will need 3*2 verts per segment + 3*2 verts per segment
    // if the cone is closed
    const unsigned int mem = tess*6 + (!bOpen ? tess*3 * (radius1 ? 2 : 1) : 0);
    positions.reserve(positions.size () + mem);

    // Now construct all segments
    const ai_real angle_delta = (ai_real)AI_MATH_TWO_PI / tess;
    const ai_real angle_max   = (ai_real)AI_MATH_TWO_PI;

    ai_real s = 1.0; // std::cos(angle == 0);
    ai_real t = 0.0; // std::sin(angle == 0);

    for (ai_real angle = 0.0; angle < angle_max; )
    {
        const aiVector3D v1 = aiVector3D (s * radius1, -halfHeight, t * radius1 );
        const aiVector3D v2 = aiVector3D (s * radius2,  halfHeight, t * radius2 );

        const ai_real next = angle + angle_delta;
        ai_real s2 = std::cos(next);
        ai_real t2 = std::sin(next);

        const aiVector3D v3 = aiVector3D (s2 * radius2,  halfHeight, t2 * radius2 );
        const aiVector3D v4 = aiVector3D (s2 * radius1, -halfHeight, t2 * radius1 );

        positions.push_back(v1);
        positions.push_back(v2);
        positions.push_back(v3);
        positions.push_back(v4);
        positions.push_back(v1);
        positions.push_back(v3);

        if (!bOpen)
        {
            // generate the end 'cap'
            positions.push_back(aiVector3D(s * radius2,  halfHeight, t * radius2 ));
            positions.push_back(aiVector3D(s2 * radius2,  halfHeight, t2 * radius2 ));
            positions.push_back(aiVector3D(0.0, halfHeight, 0.0));


            if (radius1)
            {
                // generate the other end 'cap'
                positions.push_back(aiVector3D(s * radius1,  -halfHeight, t * radius1 ));
                positions.push_back(aiVector3D(s2 * radius1,  -halfHeight, t2 * radius1 ));
                positions.push_back(aiVector3D(0.0, -halfHeight, 0.0));

            }
        }
        s = s2;
        t = t2;
        angle = next;
    }

    // Need to flip face order?
    if ( SIZE_MAX != old )  {
        for (size_t p = old; p < positions.size();p += 3) {
            std::swap(positions[p],positions[p+1]);
        }
    }
}